

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckAttrUsePropsCorrect
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaAttributeUsePtr_conflict use)

{
  int iVar1;
  int ret;
  xmlSchemaAttributeUsePtr_conflict use_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (use == (xmlSchemaAttributeUsePtr_conflict)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else if (((use->defValue == (xmlChar *)0x0) || (use->attrDecl == (xmlSchemaAttributePtr)0x0)) ||
          (use->attrDecl->type != XML_SCHEMA_TYPE_ATTRIBUTE)) {
    ctxt_local._4_4_ = 0;
  }
  else if (((use->attrDecl->defValue == (xmlChar *)0x0) || ((use->attrDecl->flags & 0x200U) == 0))
          || ((use->flags & 1U) != 0)) {
    if ((use->defVal != (xmlSchemaValPtr)0x0) && (use->attrDecl->subtypes != (xmlSchemaTypePtr)0x0))
    {
      iVar1 = xmlSchemaIsDerivedFromBuiltInType(use->attrDecl->subtypes,0x17);
      if (iVar1 != 0) {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AU_PROPS_CORRECT,
                           (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)use,
                           "Value constraints are not allowed if the type definition is or is derived from xs:ID"
                           ,(xmlChar *)0x0,(xmlChar *)0x0);
        return ctxt->err;
      }
      iVar1 = xmlSchemaVCheckCVCSimpleType
                        ((xmlSchemaAbstractCtxtPtr)ctxt,use->node,use->attrDecl->subtypes,
                         use->defValue,&use->defVal,1,1,0);
      if (iVar1 != 0) {
        if (iVar1 < 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaCheckAttrUsePropsCorrect",
                     "calling xmlSchemaVCheckCVCSimpleType()");
          return -1;
        }
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AU_PROPS_CORRECT,
                           (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)use,
                           "The value of the value constraint is not valid",(xmlChar *)0x0,
                           (xmlChar *)0x0);
        return ctxt->err;
      }
    }
    if ((use->attrDecl->defVal == (xmlSchemaValPtr)0x0) || ((use->attrDecl->flags & 1U) != 0)) {
      ctxt_local._4_4_ = 0;
    }
    else {
      iVar1 = xmlSchemaAreValuesEqual(use->defVal,use->attrDecl->defVal);
      if (iVar1 == 0) {
        xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_AU_PROPS_CORRECT_2,(xmlSchemaBasicItemPtr)use,
                            (xmlNodePtr)0x0,
                            "The \'fixed\' value constraint of the attribute use must match the attribute declaration\'s value constraint \'%s\'"
                            ,use->attrDecl->defValue);
      }
      ctxt_local._4_4_ = ctxt->err;
    }
  }
  else {
    xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_AU_PROPS_CORRECT_2,(xmlSchemaBasicItemPtr)use,
                        (xmlNodePtr)0x0,
                        "The attribute declaration has a \'fixed\' value constraint , thus the attribute use must also have a \'fixed\' value constraint"
                        ,(xmlChar *)0x0);
    ctxt_local._4_4_ = ctxt->err;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckAttrUsePropsCorrect(xmlSchemaParserCtxtPtr ctxt,
			     xmlSchemaAttributeUsePtr use)
{
    if ((ctxt == NULL) || (use == NULL))
	return(-1);
    if ((use->defValue == NULL) || (WXS_ATTRUSE_DECL(use) == NULL) ||
	((WXS_ATTRUSE_DECL(use))->type != XML_SCHEMA_TYPE_ATTRIBUTE))
	return(0);

    /*
    * SPEC au-props-correct (1)
    * "The values of the properties of an attribute use must be as
    * described in the property tableau in The Attribute Use Schema
    * Component ($3.5.1), modulo the impact of Missing
    * Sub-components ($5.3)."
    */

    if (((WXS_ATTRUSE_DECL(use))->defValue != NULL) &&
	((WXS_ATTRUSE_DECL(use))->flags & XML_SCHEMAS_ATTR_FIXED) &&
        ((use->flags & XML_SCHEMA_ATTR_USE_FIXED) == 0))
    {
	xmlSchemaPCustomErr(ctxt,
	    XML_SCHEMAP_AU_PROPS_CORRECT_2,
	    WXS_BASIC_CAST use, NULL,
	    "The attribute declaration has a 'fixed' value constraint "
	    ", thus the attribute use must also have a 'fixed' value "
	    "constraint",
	    NULL);
	return(ctxt->err);
    }
    /*
    * Compute and check the value constraint's value.
    */
    if ((use->defVal != NULL) && (WXS_ATTRUSE_TYPEDEF(use) != NULL)) {
	int ret;
	/*
	* TODO: The spec seems to be missing a check of the
	* value constraint of the attribute use. We will do it here.
	*/
	/*
	* SPEC a-props-correct (3)
	*/
	if (xmlSchemaIsDerivedFromBuiltInType(
	    WXS_ATTRUSE_TYPEDEF(use), XML_SCHEMAS_ID))
	{
	    xmlSchemaCustomErr(ACTXT_CAST ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT,
		NULL, WXS_BASIC_CAST use,
		"Value constraints are not allowed if the type definition "
		"is or is derived from xs:ID",
		NULL, NULL);
	    return(ctxt->err);
	}

	ret = xmlSchemaVCheckCVCSimpleType(ACTXT_CAST ctxt,
	    use->node, WXS_ATTRUSE_TYPEDEF(use),
	    use->defValue, &(use->defVal),
	    1, 1, 0);
	if (ret != 0) {
	    if (ret < 0) {
		PERROR_INT2("xmlSchemaCheckAttrUsePropsCorrect",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		return(-1);
	    }
	    xmlSchemaCustomErr(ACTXT_CAST ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT,
		NULL, WXS_BASIC_CAST use,
		"The value of the value constraint is not valid",
		NULL, NULL);
	    return(ctxt->err);
	}
    }
    /*
    * SPEC au-props-correct (2)
    * "If the {attribute declaration} has a fixed
    * {value constraint}, then if the attribute use itself has a
    * {value constraint}, it must also be fixed and its value must match
    * that of the {attribute declaration}'s {value constraint}."
    */
    if (((WXS_ATTRUSE_DECL(use))->defVal != NULL) &&
	(((WXS_ATTRUSE_DECL(use))->flags & XML_SCHEMA_ATTR_USE_FIXED) == 0))
    {
	if (! xmlSchemaAreValuesEqual(use->defVal,
		(WXS_ATTRUSE_DECL(use))->defVal))
	{
	    xmlSchemaPCustomErr(ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT_2,
		WXS_BASIC_CAST use, NULL,
		"The 'fixed' value constraint of the attribute use "
		"must match the attribute declaration's value "
		"constraint '%s'",
		(WXS_ATTRUSE_DECL(use))->defValue);
	}
	return(ctxt->err);
    }
    return(0);
}